

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

bool __thiscall
TasGrid::GridLocalPolynomial::addParent<(TasGrid::RuleLocal::erule)2>
          (GridLocalPolynomial *this,int *point,int direction,MultiIndexSet *exclude,
          Data2D<int> *destination)

{
  int iVar1;
  bool bVar2;
  vector<int,_std::allocator<int>_> dad;
  allocator_type local_49;
  int *local_48 [2];
  long local_38;
  
  ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)local_48,point,
             point + (this->super_BaseCanonicalGrid).num_dimensions,&local_49);
  iVar1 = point[direction];
  iVar1 = ((iVar1 - (iVar1 + 1 >> 0x1f)) + 1 >> 1) - (uint)(iVar1 < 4);
  local_48[0][direction] = iVar1;
  if ((iVar1 == -1) || (iVar1 = MultiIndexSet::getSlot(exclude,local_48[0]), iVar1 != -1)) {
    bVar2 = false;
  }
  else {
    ::std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
              ((vector<int,std::allocator<int>> *)&destination->vec,
               (destination->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,local_48[0],local_48[0] + destination->stride);
    destination->num_strips = destination->num_strips + 1;
    bVar2 = true;
  }
  iVar1 = 2;
  if (point[direction] != 3) {
    iVar1 = (uint)(point[direction] == 4) * 2 + -1;
  }
  local_48[0][direction] = iVar1;
  if (iVar1 != -1) {
    iVar1 = MultiIndexSet::getSlot(exclude,local_48[0]);
    if (iVar1 == -1) {
      ::std::vector<int,std::allocator<int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                ((vector<int,std::allocator<int>> *)&destination->vec,
                 (destination->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_48[0],local_48[0] + destination->stride);
      destination->num_strips = destination->num_strips + 1;
      bVar2 = true;
    }
    if (local_48[0] == (int *)0x0) {
      return bVar2;
    }
  }
  operator_delete(local_48[0],local_38 - (long)local_48[0]);
  return bVar2;
}

Assistant:

bool GridLocalPolynomial::addParent(const int point[], int direction, const MultiIndexSet &exclude, Data2D<int> &destination) const{
    std::vector<int> dad(point, point + num_dimensions);
    bool added = false;
    dad[direction] = RuleLocal::getParent<effrule>(point[direction]);
    if ((dad[direction] != -1) && exclude.missing(dad)){
        destination.appendStrip(dad);
        added = true;
    }
    dad[direction] = RuleLocal::getStepParent<effrule>(point[direction]);
    if ((dad[direction] != -1) && exclude.missing(dad)){
        destination.appendStrip(dad);
        added = true;
    }
    return added;
}